

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLProblemBuilderTest_OnHeader_Test::TestBody(NLProblemBuilderTest_OnHeader_Test *this)

{
  MockSpec<void_(const_mp::NLProblemInfo_&)> *this_00;
  NLHeader h;
  NLHeader *local_148;
  MatcherBase<const_mp::NLProblemInfo_&> local_140;
  NLHeader local_128;
  
  mp::NLHeader::NLHeader(&local_128);
  local_148 = &local_128;
  testing::internal::RefMatcher::operator_cast_to_Matcher
            ((Matcher<const_mp::NLProblemInfo_&> *)&local_140,(RefMatcher *)&local_148);
  this_00 = MockProblemBuilder::gmock_SetInfo
                      (&(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder,
                       (Matcher<const_mp::NLProblemInfo_&> *)&local_140);
  testing::internal::MockSpec<void_(const_mp::NLProblemInfo_&)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x70b,"builder","SetInfo(testing::Ref(h))");
  testing::internal::MatcherBase<const_mp::NLProblemInfo_&>::~MatcherBase(&local_140);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::OnHeader
            (&(this->super_NLProblemBuilderTest).adapter,&local_128);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnHeader) {
  NLHeader h;
  EXPECT_CALL(builder, SetInfo(testing::Ref(h)));
  adapter.OnHeader(h);
}